

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

int32_t __thiscall
aeron::archive::AeronArchive::listRecording
          (AeronArchive *this,int64_t recordingId,RecordingDescriptorConsumer *consumer)

{
  int64_t iVar1;
  anon_class_16_2_7d676519 local_50;
  function<bool_(long)> local_40;
  RecordingDescriptorConsumer *local_20;
  RecordingDescriptorConsumer *consumer_local;
  int64_t recordingId_local;
  AeronArchive *this_local;
  
  local_50.recordingId = (int64_t *)&consumer_local;
  local_50.this = this;
  local_20 = consumer;
  consumer_local = (RecordingDescriptorConsumer *)recordingId;
  recordingId_local = (int64_t)this;
  std::function<bool(long)>::
  function<aeron::archive::AeronArchive::listRecording(long,std::function<void(long,long,long,long,long,long,long,int,int,int,int,int,int,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>&&)::__0,void>
            ((function<bool(long)> *)&local_40,&local_50);
  iVar1 = callAndPollForDescriptors(this,&local_40,1,local_20,"list recording");
  std::function<bool_(long)>::~function(&local_40);
  return (int32_t)iVar1;
}

Assistant:

std::int32_t AeronArchive::listRecording(std::int64_t recordingId, RecordingDescriptorConsumer&& consumer) {
    return callAndPollForDescriptors(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->listRecording(recordingId, correlationId, controlSessionId_);
        },
        1, std::move(consumer), "list recording");
}